

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

size_t __thiscall Memory::RecyclerHeapObjectInfo::GetSize(RecyclerHeapObjectInfo *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  ulong uVar4;
  undefined8 *in_FS_OFFSET;
  
  if (this->m_heapBlock == (HeapBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x2456,"(m_heapBlock)","m_heapBlock");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
  }
  if (this->isUsingLargeHeapBlock == true) {
    uVar4 = ((this->field_3).m_largeHeapBlockHeader)->objectSize;
  }
  else {
    uVar4 = (ulong)*(ushort *)((long)&this->m_heapBlock[2].segment + 4);
  }
  if (this->m_recycler->verifyEnabled != false) {
    uVar4 = uVar4 - *(long *)((long)this->m_address + (uVar4 - 8));
  }
  return uVar4;
}

Assistant:

size_t
RecyclerHeapObjectInfo::GetSize() const
{
    Assert(m_heapBlock);

    size_t size;
#if LARGEHEAPBLOCK_ENCODING
    if (isUsingLargeHeapBlock)
    {
        size = m_largeHeapBlockHeader->objectSize;
    }
#else
    if (m_heapBlock->IsLargeHeapBlock())
    {
        size = ((LargeHeapBlock*)m_heapBlock)->GetObjectSize(m_address);
    }
#endif
    else
    {
        // All small heap block types have the same layout for the object size field.
        size = ((SmallHeapBlock*)m_heapBlock)->GetObjectSize();
    }